

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZone::OffsetData>::emplace<QTimeZone::OffsetData>
          (QMovableArrayOps<QTimeZone::OffsetData> *this,qsizetype i,OffsetData *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  long in_RSI;
  QArrayDataPointer<QTimeZone::OffsetData> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  OffsetData tmp;
  OffsetData *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar3;
  Inserter *in_stack_ffffffffffffff70;
  GrowthPosition in_stack_ffffffffffffff7c;
  undefined2 in_stack_ffffffffffffff84;
  byte bVar4;
  Inserter local_60;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QTimeZone::OffsetData>::needsDetach
                    ((QArrayDataPointer<QTimeZone::OffsetData> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QTimeZone::OffsetData>::freeSpaceAtEnd(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QTimeZone::OffsetData>::end
                ((QArrayDataPointer<QTimeZone::OffsetData> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QTimeZone::OffsetData::OffsetData
                ((OffsetData *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00585ad9;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QTimeZone::OffsetData>::freeSpaceAtBegin(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QTimeZone::OffsetData>::begin
                ((QArrayDataPointer<QTimeZone::OffsetData> *)0x58597a);
      QTimeZone::OffsetData::OffsetData
                ((OffsetData *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00585ad9;
    }
  }
  memset(local_38,0xaa,0x30);
  QTimeZone::OffsetData::OffsetData
            ((OffsetData *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  uVar3 = in_RDI->size != 0 && in_RSI == 0;
  bVar4 = uVar3;
  QArrayDataPointer<QTimeZone::OffsetData>::detachAndGrow
            ((QArrayDataPointer<QTimeZone::OffsetData> *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff84,(uint)(byte)uVar3))),
             in_stack_ffffffffffffff7c,(qsizetype)in_stack_ffffffffffffff70,(OffsetData **)in_RDI,
             (QArrayDataPointer<QTimeZone::OffsetData> *)CONCAT17(uVar3,in_stack_ffffffffffffff60));
  if ((bVar4 & 1) == 0) {
    Inserter::Inserter(in_stack_ffffffffffffff70,in_RDI,CONCAT17(uVar3,in_stack_ffffffffffffff60),
                       (qsizetype)in_stack_ffffffffffffff58);
    Inserter::insertOne((Inserter *)CONCAT17(uVar3,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    Inserter::~Inserter(&local_60);
  }
  else {
    QArrayDataPointer<QTimeZone::OffsetData>::begin
              ((QArrayDataPointer<QTimeZone::OffsetData> *)0x585a35);
    QTimeZone::OffsetData::OffsetData
              ((OffsetData *)CONCAT17(uVar3,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QTimeZone::OffsetData::~OffsetData((OffsetData *)CONCAT17(uVar3,in_stack_ffffffffffffff60));
LAB_00585ad9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }